

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall
icu_63::UnifiedCache::_get
          (UnifiedCache *this,CacheKeyBase *key,SharedObject **value,void *creationContext,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UErrorCode *status_local;
  void *creationContext_local;
  SharedObject **value_local;
  CacheKeyBase *key_local;
  UnifiedCache *this_local;
  
  iVar2 = _poll(this,(pollfd *)key,(nfds_t)value,(int)status);
  if ((char)iVar2 == '\0') {
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      iVar2 = (*(key->super_UObject)._vptr_UObject[6])(key,creationContext,status);
      *value = (SharedObject *)CONCAT44(extraout_var,iVar2);
      if (*value == (SharedObject *)0x0) {
        SharedObject::copyPtr<icu_63::SharedObject>(this->fNoValue,value);
      }
      _putIfAbsentAndGet(this,key,value,status);
      if (*value == this->fNoValue) {
        SharedObject::clearPtr<icu_63::SharedObject>(value);
      }
    }
  }
  else if (*value == this->fNoValue) {
    SharedObject::clearPtr<icu_63::SharedObject>(value);
  }
  return;
}

Assistant:

void UnifiedCache::_get(
        const CacheKeyBase &key,
        const SharedObject *&value,
        const void *creationContext,
        UErrorCode &status) const {
    U_ASSERT(value == NULL);
    U_ASSERT(status == U_ZERO_ERROR);
    if (_poll(key, value, status)) {
        if (value == fNoValue) {
            SharedObject::clearPtr(value);
        }
        return;
    }
    if (U_FAILURE(status)) {
        return;
    }
    value = key.createObject(creationContext, status);
    U_ASSERT(value == NULL || value->hasHardReferences());
    U_ASSERT(value != NULL || status != U_ZERO_ERROR);
    if (value == NULL) {
        SharedObject::copyPtr(fNoValue, value);
    }
    _putIfAbsentAndGet(key, value, status);
    if (value == fNoValue) {
        SharedObject::clearPtr(value);
    }
}